

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O2

void __thiscall layer::Convolution2D::conf(Convolution2D *this,int sizeXIn,int sizeYIn,int sizeZIn)

{
  uint uVar1;
  uint uVar2;
  
  this->_sizeXIn = sizeXIn;
  this->_sizeYIn = sizeYIn;
  (this->super_Layer)._sizeZWeight = sizeZIn;
  uVar1 = (this->super_Layer)._sizeXWeight;
  uVar2 = (this->super_Layer)._sizeYWeight;
  (this->super_Layer)._sizeXOut =
       (int)((sizeXIn + this->_zeroPaddingX * 2) - (((int)uVar1 >> 1) + (uVar1 & 1))) / this->_stepX
  ;
  (this->super_Layer)._sizeYOut =
       (int)((sizeYIn + this->_zeroPaddingY * 2) - (((int)uVar2 >> 1) + (uVar2 & 1))) / this->_stepY
  ;
  return;
}

Assistant:

void Convolution2D::conf(int sizeXIn, int sizeYIn, int sizeZIn)
    {
        _sizeXIn = sizeXIn;
        _sizeYIn = sizeYIn;

        _sizeZWeight = sizeZIn;

        _sizeXOut = (sizeXIn + (_zeroPaddingX<<1) - (_sizeXWeight&1 ? (_sizeXWeight>>1)+1 : _sizeXWeight>>1)) / _stepX;
        _sizeYOut = (sizeYIn + (_zeroPaddingY<<1) - (_sizeYWeight&1 ? (_sizeYWeight>>1)+1 : _sizeYWeight>>1)) / _stepY;
    }